

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O2

void __thiscall
asio::detail::strand_service::
dispatch<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,std::error_code_const&,unsigned_long)>>,std::error_code,unsigned_long>>
          (strand_service *this,implementation_type *impl,
          binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>
          *handler)

{
  io_context_impl *owner;
  bool bVar1;
  uchar *puVar2;
  completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
  *pcVar3;
  long in_FS_OFFSET;
  on_dispatch_exit on_exit;
  context ctx;
  ptr local_70;
  on_dispatch_exit local_58;
  implementation_type local_48;
  implementation_type *local_40;
  undefined8 local_38;
  error_code local_30;
  
  puVar2 = call_stack<asio::detail::strand_service::strand_impl,_unsigned_char>::contains(*impl);
  if (puVar2 == (uchar *)0x0) {
    local_70.h = handler;
    pcVar3 = completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
             ::ptr::allocate(handler);
    local_70.p = (completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
                  *)0x0;
    local_70.v = pcVar3;
    completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
    ::completion_handler(pcVar3,handler);
    local_70.p = pcVar3;
    bVar1 = do_dispatch(this,impl,&pcVar3->super_operation);
    pcVar3 = local_70.p;
    local_70.v = (completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
                  *)0x0;
    local_70.p = (completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
                  *)0x0;
    if (bVar1) {
      local_48 = *impl;
      local_38 = *(undefined8 *)(in_FS_OFFSET + -8);
      local_40 = &local_48;
      *(implementation_type **)(in_FS_OFFSET + -8) = local_40;
      owner = this->io_context_;
      local_58.impl_ = *impl;
      local_30._M_value = 0;
      local_58.io_context_ = owner;
      local_30._M_cat = (error_category *)std::_V2::system_category();
      completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
      ::do_complete(owner,&pcVar3->super_operation,&local_30,0);
      on_dispatch_exit::~on_dispatch_exit(&local_58);
      *(undefined8 *)(in_FS_OFFSET + -8) = local_38;
    }
    completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
    ::ptr::~ptr(&local_70);
  }
  else {
    binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>
    ::operator()(handler);
  }
  return;
}

Assistant:

void strand_service::dispatch(strand_service::implementation_type& impl,
    Handler& handler)
{
  // If we are already in the strand then the handler can run immediately.
  if (call_stack<strand_impl>::contains(impl))
  {
    fenced_block b(fenced_block::full);
    asio_handler_invoke_helpers::invoke(handler, handler);
    return;
  }

  // Allocate and construct an operation to wrap the handler.
  typedef completion_handler<Handler> op;
  typename op::ptr p = { asio::detail::addressof(handler),
    op::ptr::allocate(handler), 0 };
  p.p = new (p.v) op(handler);

  ASIO_HANDLER_CREATION((this->context(),
        *p.p, "strand", impl, 0, "dispatch"));

  bool dispatch_immediately = do_dispatch(impl, p.p);
  operation* o = p.p;
  p.v = p.p = 0;

  if (dispatch_immediately)
  {
    // Indicate that this strand is executing on the current thread.
    call_stack<strand_impl>::context ctx(impl);

    // Ensure the next handler, if any, is scheduled on block exit.
    on_dispatch_exit on_exit = { &io_context_, impl };
    (void)on_exit;

    completion_handler<Handler>::do_complete(
        &io_context_, o, asio::error_code(), 0);
  }
}